

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_buffer.cpp
# Opt level: O3

void __thiscall
duckdb::FixedSizeBuffer::FixedSizeBuffer(FixedSizeBuffer *this,BlockManager *block_manager)

{
  BufferHandle *this_00;
  optional_ptr<duckdb::FileBuffer,_true> *this_01;
  BufferManager *pBVar1;
  idx_t iVar2;
  idx_t iVar3;
  BufferHandle BStack_48;
  
  this->block_manager = block_manager;
  this->segment_count = 0;
  this->allocation_size = 0;
  this->dirty = false;
  this->vacuum = false;
  (this->block_pointer).block_id = -1;
  (this->block_pointer).offset = 0;
  (this->block_pointer).unused_padding = 0;
  this_00 = &this->buffer_handle;
  BufferHandle::BufferHandle(this_00);
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  (this->block_handle).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->block_handle).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pBVar1 = block_manager->buffer_manager;
  iVar2 = optional_idx::GetIndex(&block_manager->block_alloc_size);
  iVar3 = optional_idx::GetIndex(&block_manager->block_header_size);
  (*pBVar1->_vptr_BufferManager[5])(&BStack_48,pBVar1,5,block_manager,0);
  BufferHandle::operator=(this_00,&BStack_48);
  BufferHandle::~BufferHandle(&BStack_48);
  shared_ptr<duckdb::BlockHandle,_true>::operator=(&this->block_handle,&this_00->handle);
  this_01 = &(this->buffer_handle).node;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_01);
  switchD_005681f0::default(this_01->ptr->buffer,0,iVar2 - iVar3);
  return;
}

Assistant:

FixedSizeBuffer::FixedSizeBuffer(BlockManager &block_manager)
    : block_manager(block_manager), segment_count(0), allocation_size(0), dirty(false), vacuum(false), block_pointer(),
      block_handle(nullptr) {

	auto &buffer_manager = block_manager.buffer_manager;
	auto block_size = block_manager.GetBlockSize();
	buffer_handle = buffer_manager.Allocate(MemoryTag::ART_INDEX, &block_manager, false);
	block_handle = buffer_handle.GetBlockHandle();

	// Zero-initialize the buffer as it might get serialized to storage.
	memset(buffer_handle.Ptr(), 0, block_size);
}